

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void sse::BitwiseXor(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                    uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                    uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  uint *puVar1;
  uint *puVar2;
  uint8_t *puVar3;
  long lVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  undefined1 auVar8 [16];
  
  uVar5 = (ulong)totalSimdWidth;
  puVar6 = in1Y + uVar5;
  puVar7 = in2Y + uVar5;
  puVar3 = outY + uVar5;
  for (; outY != outYEnd; outY = outY + rowSizeOut) {
    for (lVar4 = 0; (ulong)simdWidth << 4 != lVar4; lVar4 = lVar4 + 0x10) {
      puVar1 = (uint *)(in2Y + lVar4);
      puVar2 = (uint *)(in1Y + lVar4);
      auVar8._0_4_ = *puVar1 ^ *puVar2;
      auVar8._4_4_ = puVar1[1] ^ puVar2[1];
      auVar8._8_4_ = puVar1[2] ^ puVar2[2];
      auVar8._12_4_ = puVar1[3] ^ puVar2[3];
      *(undefined1 (*) [16])(outY + lVar4) = auVar8;
    }
    if (nonSimdWidth != 0) {
      for (uVar5 = 0; nonSimdWidth != uVar5; uVar5 = uVar5 + 1) {
        puVar3[uVar5] = puVar7[uVar5] ^ puVar6[uVar5];
      }
    }
    in1Y = in1Y + rowSizeIn1;
    in2Y = in2Y + rowSizeIn2;
    puVar6 = puVar6 + rowSizeIn1;
    puVar7 = puVar7 + rowSizeIn2;
    puVar3 = puVar3 + rowSizeOut;
  }
  return;
}

Assistant:

void BitwiseXor( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                     uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst )
                _mm_storeu_si128( dst, _mm_xor_si128( _mm_loadu_si128( src1 ), _mm_loadu_si128( src2 ) ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = (*in1X) ^ (*in2X);
            }
        }
    }